

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O2

void __thiscall Field::Field(Field *this,int from,int to,string *str)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  uint32_t uVar6;
  
  this->from = from;
  this->to = to;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->value = 0;
  this->match = true;
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  sVar4 = 0;
  bVar5 = true;
  uVar6 = 0;
  do {
    if (sVar3 == sVar4) {
      if (bVar5) {
        this->expand = false;
      }
      else {
        this->value = 0;
        std::__cxx11::string::_M_assign((string *)&this->name);
        this->expand = to - from == 1;
      }
      return;
    }
    cVar1 = pcVar2[sVar4];
    if (cVar1 == '0') {
      uVar6 = uVar6 * 2;
LAB_0010291f:
      this->value = uVar6;
    }
    else {
      if (cVar1 == '1') {
        uVar6 = uVar6 * 2 + 1;
        goto LAB_0010291f;
      }
      this->match = false;
      bVar5 = false;
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

Field::Field(int from, int to, std::string str)
    : from(from), to(to)
{
    value = 0;
    match = true;
    
    for(char c : str)
    {
        if(c == '1')
            value = 2 * value + 1;
        else if(c == '0')
            value = 2 * value;
        else
            match = false;
    }
    if(!match)
    {
        value = 0;
        name = str;
        expand = (to - from == 1);
    }
    else
        expand = false;
}